

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MSX.cpp
# Opt level: O2

HalfCycles __thiscall
MSX::ConcreteMachine<(Analyser::Static::MSX::Target::Model)0,_true>::perform_machine_cycle
          (ConcreteMachine<(Analyser::Static::MSX::Target::Model)0,_true> *this,
          PartialMachineCycle *cycle)

{
  HalfCycles *pHVar1;
  HandledSlot *this_00;
  Processor<MSX::ConcreteMachine<(Analyser::Static::MSX::Target::Model)0,_true>,_false,_false>
  *this_01;
  uint8_t uVar2;
  uint8_t uVar3;
  uint8_t uVar4;
  Operation OVar5;
  _Tuple_impl<0UL,_MSX::MemorySlotHandler_*,_std::default_delete<MSX::MemorySlotHandler>_> _Var6;
  IntType IVar7;
  pointer pcVar8;
  bool bVar9;
  byte bVar10;
  ushort uVar11;
  uint uVar12;
  int iVar13;
  ssize_t sVar14;
  uint8_t *puVar15;
  uint8_t *puVar16;
  size_t sVar17;
  int iVar18;
  WrappedInt<HalfCycles> WVar19;
  uint __fd;
  uint uVar20;
  HalfCycles rhs;
  ulong uVar21;
  unique_ptr<TI::TMS::TMS9918<(TI::TMS::Personality)0>,_JustInTimeActor<TI::TMS::TMS9918<(TI::TMS::Personality)0>,_HalfCycles,_1,_1>::SequencePointAwareDeleter>
  uVar22;
  unique_ptr<Storage::Tape::MSX::Parser::FileSpeed,_std::default_delete<Storage::Tape::MSX::Parser::FileSpeed>_>
  new_speed;
  _Head_base<0UL,_TI::TMS::TMS9918<(TI::TMS::Personality)0>_*,_false> local_50;
  
  WVar19.length_._4_4_ = 0;
  WVar19.length_._0_4_ = (uint)(cycle->operation == ReadOpcode) * 2;
  rhs.super_WrappedInt<HalfCycles>.length_ =
       (WrappedInt<HalfCycles>)
       ((cycle->length).super_WrappedInt<HalfCycles>.length_ + WVar19.length_);
  bVar9 = JustInTimeActor<TI::TMS::TMS9918<(TI::TMS::Personality)0>,_HalfCycles,_1,_1>::operator+=
                    (&this->vdp_,rhs);
  if (bVar9) {
    JustInTimeActor<TI::TMS::TMS9918<(TI::TMS::Personality)0>,_HalfCycles,_1,_1>::operator->
              ((JustInTimeActor<TI::TMS::TMS9918<(TI::TMS::Personality)0>,_HalfCycles,_1,_1> *)
               &new_speed);
    bVar9 = TI::TMS::TMS9918<(TI::TMS::Personality)0>::get_interrupt_line(local_50._M_head_impl);
    CPU::Z80::ProcessorBase::set_interrupt_line
              (&(this->z80_).super_ProcessorBase,bVar9,
               (HalfCycles)(this->vdp_).time_overrun_.super_WrappedInt<HalfCycles>.length_);
    std::
    unique_ptr<TI::TMS::TMS9918<(TI::TMS::Personality)0>,_JustInTimeActor<TI::TMS::TMS9918<(TI::TMS::Personality)0>,_HalfCycles,_1,_1>::SequencePointAwareDeleter>
    ::~unique_ptr((unique_ptr<TI::TMS::TMS9918<(TI::TMS::Personality)0>,_JustInTimeActor<TI::TMS::TMS9918<(TI::TMS::Personality)0>,_HalfCycles,_1,_1>::SequencePointAwareDeleter>
                   *)&new_speed);
  }
  (this->time_since_ay_update_).super_WrappedInt<HalfCycles>.length_ =
       (this->time_since_ay_update_).super_WrappedInt<HalfCycles>.length_ +
       (long)rhs.super_WrappedInt<HalfCycles>.length_;
  pHVar1 = &this->memory_slots_[0].cycles_since_update;
  (pHVar1->super_WrappedInt<HalfCycles>).length_ =
       (pHVar1->super_WrappedInt<HalfCycles>).length_ +
       (long)rhs.super_WrappedInt<HalfCycles>.length_;
  pHVar1 = &this->memory_slots_[1].cycles_since_update;
  (pHVar1->super_WrappedInt<HalfCycles>).length_ =
       (pHVar1->super_WrappedInt<HalfCycles>).length_ +
       (long)rhs.super_WrappedInt<HalfCycles>.length_;
  pHVar1 = &this->memory_slots_[2].cycles_since_update;
  (pHVar1->super_WrappedInt<HalfCycles>).length_ =
       (pHVar1->super_WrappedInt<HalfCycles>).length_ +
       (long)rhs.super_WrappedInt<HalfCycles>.length_;
  pHVar1 = &this->memory_slots_[3].cycles_since_update;
  (pHVar1->super_WrappedInt<HalfCycles>).length_ =
       (pHVar1->super_WrappedInt<HalfCycles>).length_ +
       (long)rhs.super_WrappedInt<HalfCycles>.length_;
  OVar5 = cycle->operation;
  if (8 < (int)OVar5) goto switchD_0030b7cc_caseD_9a;
  if (cycle->address == (ushort *)0x0) {
    uVar11 = 0;
  }
  else {
    uVar11 = *cycle->address;
  }
  if (Interrupt < OVar5) goto switchD_0030b7cc_caseD_9a;
  this_00 = this->memory_slots_;
  bVar10 = (byte)(uVar11 >> 8);
  switch(OVar5) {
  case ReadOpcode:
    if (this->use_fast_tape_ == true) {
      if (uVar11 == 0) {
LAB_0030ba0b:
        this->pc_zero_accesses_ = this->pc_zero_accesses_ + 1;
      }
      else {
        if (uVar11 == 0x1abc) {
          puVar15 = ram(this);
          new_speed._M_t.
          super___uniq_ptr_impl<Storage::Tape::MSX::Parser::FileSpeed,_std::default_delete<Storage::Tape::MSX::Parser::FileSpeed>_>
          ._M_t.
          super__Tuple_impl<0UL,_Storage::Tape::MSX::Parser::FileSpeed_*,_std::default_delete<Storage::Tape::MSX::Parser::FileSpeed>_>
          .super__Head_base<0UL,_Storage::Tape::MSX::Parser::FileSpeed_*,_false>._M_head_impl._0_1_
               = puVar15[0xfca4];
          puVar15 = ram(this);
          new_speed._M_t.
          super___uniq_ptr_impl<Storage::Tape::MSX::Parser::FileSpeed,_std::default_delete<Storage::Tape::MSX::Parser::FileSpeed>_>
          ._M_t.
          super__Tuple_impl<0UL,_Storage::Tape::MSX::Parser::FileSpeed_*,_std::default_delete<Storage::Tape::MSX::Parser::FileSpeed>_>
          .super__Head_base<0UL,_Storage::Tape::MSX::Parser::FileSpeed_*,_false>._M_head_impl._1_1_
               = puVar15[0xfca5];
          iVar13 = Storage::Tape::MSX::Parser::get_byte((FileSpeed *)&new_speed,&this->tape_player_)
          ;
          if (iVar13 >= 0) {
            CPU::Z80::ProcessorBase::set_value_of
                      (&(this->z80_).super_ProcessorBase,A,(uint16_t)iVar13);
          }
          CPU::Z80::ProcessorBase::set_value_of
                    (&(this->z80_).super_ProcessorBase,Flags,(ushort)(iVar13 < 0));
          *cycle->value = 0xc9;
          break;
        }
        if (uVar11 == 0x1a63) {
          Intel::i8255::
          i8255<MSX::ConcreteMachine<(Analyser::Static::MSX::Target::Model)0,_true>::i8255PortHandler>
          ::write(&this->i8255_,0xab,(void *)0x8,(ulong)uVar11);
          this_01 = &this->z80_;
          CPU::Z80::ProcessorBase::set_value_of(&this_01->super_ProcessorBase,IFF1,0);
          CPU::Z80::ProcessorBase::set_value_of(&this_01->super_ProcessorBase,IFF2,0);
          Storage::Tape::MSX::Parser::find_header((Parser *)&new_speed,&this->tape_player_);
          puVar15 = (uint8_t *)
                    CONCAT62(new_speed._M_t.
                             super___uniq_ptr_impl<Storage::Tape::MSX::Parser::FileSpeed,_std::default_delete<Storage::Tape::MSX::Parser::FileSpeed>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_Storage::Tape::MSX::Parser::FileSpeed_*,_std::default_delete<Storage::Tape::MSX::Parser::FileSpeed>_>
                             .super__Head_base<0UL,_Storage::Tape::MSX::Parser::FileSpeed_*,_false>.
                             _M_head_impl._2_6_,
                             CONCAT11(new_speed._M_t.
                                      super___uniq_ptr_impl<Storage::Tape::MSX::Parser::FileSpeed,_std::default_delete<Storage::Tape::MSX::Parser::FileSpeed>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_Storage::Tape::MSX::Parser::FileSpeed_*,_std::default_delete<Storage::Tape::MSX::Parser::FileSpeed>_>
                                      .
                                      super__Head_base<0UL,_Storage::Tape::MSX::Parser::FileSpeed_*,_false>
                                      ._M_head_impl._1_1_,
                                      (uint8_t)new_speed._M_t.
                                               super___uniq_ptr_impl<Storage::Tape::MSX::Parser::FileSpeed,_std::default_delete<Storage::Tape::MSX::Parser::FileSpeed>_>
                                               ._M_t.
                                               super__Tuple_impl<0UL,_Storage::Tape::MSX::Parser::FileSpeed_*,_std::default_delete<Storage::Tape::MSX::Parser::FileSpeed>_>
                                               .
                                               super__Head_base<0UL,_Storage::Tape::MSX::Parser::FileSpeed_*,_false>
                                               ._M_head_impl));
          if (puVar15 != (uint8_t *)0x0) {
            uVar2 = *puVar15;
            puVar16 = ram(this);
            puVar16[0xfca4] = uVar2;
            uVar2 = *(uint8_t *)
                     (CONCAT62(new_speed._M_t.
                               super___uniq_ptr_impl<Storage::Tape::MSX::Parser::FileSpeed,_std::default_delete<Storage::Tape::MSX::Parser::FileSpeed>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_Storage::Tape::MSX::Parser::FileSpeed_*,_std::default_delete<Storage::Tape::MSX::Parser::FileSpeed>_>
                               .
                               super__Head_base<0UL,_Storage::Tape::MSX::Parser::FileSpeed_*,_false>
                               ._M_head_impl._2_6_,
                               CONCAT11(new_speed._M_t.
                                        super___uniq_ptr_impl<Storage::Tape::MSX::Parser::FileSpeed,_std::default_delete<Storage::Tape::MSX::Parser::FileSpeed>_>
                                        ._M_t.
                                        super__Tuple_impl<0UL,_Storage::Tape::MSX::Parser::FileSpeed_*,_std::default_delete<Storage::Tape::MSX::Parser::FileSpeed>_>
                                        .
                                        super__Head_base<0UL,_Storage::Tape::MSX::Parser::FileSpeed_*,_false>
                                        ._M_head_impl._1_1_,
                                        (uint8_t)new_speed._M_t.
                                                 super___uniq_ptr_impl<Storage::Tape::MSX::Parser::FileSpeed,_std::default_delete<Storage::Tape::MSX::Parser::FileSpeed>_>
                                                 ._M_t.
                                                 super__Tuple_impl<0UL,_Storage::Tape::MSX::Parser::FileSpeed_*,_std::default_delete<Storage::Tape::MSX::Parser::FileSpeed>_>
                                                 .
                                                 super__Head_base<0UL,_Storage::Tape::MSX::Parser::FileSpeed_*,_false>
                                                 ._M_head_impl)) + 1);
            puVar16 = ram(this);
            puVar16[0xfca5] = uVar2;
          }
          CPU::Z80::ProcessorBase::set_value_of
                    (&this_01->super_ProcessorBase,Flags,(ushort)(puVar15 == (uint8_t *)0x0));
          *cycle->value = 0xc9;
          std::
          unique_ptr<Storage::Tape::MSX::Parser::FileSpeed,_std::default_delete<Storage::Tape::MSX::Parser::FileSpeed>_>
          ::~unique_ptr(&new_speed);
          break;
        }
      }
    }
    else if (uVar11 == 0) goto LAB_0030ba0b;
    this->pc_address_ = uVar11;
  case Read:
    if ((uVar11 == 0xffff) &&
       ((this->final_slot_->super_PrimarySlot).supports_secondary_paging == true)) {
      bVar10 = PrimarySlot::secondary_paging(&this->final_slot_->super_PrimarySlot);
      bVar10 = ~bVar10;
    }
    else if (this->read_pointers_[uVar11 >> 0xd] == (uint8_t *)0x0) {
      uVar12 = this->primary_slots_ >> (bVar10 >> 5 & 6) & 3;
      _Var6.super__Head_base<0UL,_MSX::MemorySlotHandler_*,_false>._M_head_impl =
           this->memory_slots_[uVar12].handler._M_t.
           super___uniq_ptr_impl<MSX::MemorySlotHandler,_std::default_delete<MSX::MemorySlotHandler>_>
           ._M_t.
           super__Tuple_impl<0UL,_MSX::MemorySlotHandler_*,_std::default_delete<MSX::MemorySlotHandler>_>
           .super__Head_base<0UL,_MSX::MemorySlotHandler_*,_false>;
      IVar7 = this->memory_slots_[uVar12].cycles_since_update.super_WrappedInt<HalfCycles>.length_;
      this->memory_slots_[uVar12].cycles_since_update.super_WrappedInt<HalfCycles>.length_ = 0;
      (**(code **)(*(long *)_Var6.super__Head_base<0UL,_MSX::MemorySlotHandler_*,_false>.
                            _M_head_impl + 0x10))
                (_Var6.super__Head_base<0UL,_MSX::MemorySlotHandler_*,_false>._M_head_impl,IVar7);
      _Var6.super__Head_base<0UL,_MSX::MemorySlotHandler_*,_false>._M_head_impl =
           this->memory_slots_[uVar12].handler._M_t.
           super___uniq_ptr_impl<MSX::MemorySlotHandler,_std::default_delete<MSX::MemorySlotHandler>_>
           ._M_t.
           super__Tuple_impl<0UL,_MSX::MemorySlotHandler_*,_std::default_delete<MSX::MemorySlotHandler>_>
           .super__Head_base<0UL,_MSX::MemorySlotHandler_*,_false>;
      bVar10 = (**(code **)(*(long *)_Var6.super__Head_base<0UL,_MSX::MemorySlotHandler_*,_false>.
                                     _M_head_impl + 0x20))
                         (_Var6.super__Head_base<0UL,_MSX::MemorySlotHandler_*,_false>._M_head_impl,
                          uVar11);
    }
    else {
      bVar10 = this->read_pointers_[uVar11 >> 0xd][uVar11 & 0x1fff];
    }
LAB_0030baab:
    *cycle->value = bVar10;
    break;
  case Write:
    if ((uVar11 == 0xffff) &&
       ((this->final_slot_->super_PrimarySlot).supports_secondary_paging == true)) {
      PrimarySlot::set_secondary_paging(&this->final_slot_->super_PrimarySlot,*cycle->value);
      update_paging(this);
    }
    else {
      uVar12 = this->primary_slots_ >> (bVar10 >> 5 & 6) & 3;
      if ((MemorySlotHandler *)
          this->memory_slots_[uVar12].handler._M_t.
          super___uniq_ptr_impl<MSX::MemorySlotHandler,_std::default_delete<MSX::MemorySlotHandler>_>
          ._M_t.
          super__Tuple_impl<0UL,_MSX::MemorySlotHandler_*,_std::default_delete<MSX::MemorySlotHandler>_>
          .super__Head_base<0UL,_MSX::MemorySlotHandler_*,_false> == (MemorySlotHandler *)0x0) {
        this->write_pointers_[uVar11 >> 0xd][uVar11 & 0x1fff] = *cycle->value;
      }
      else {
        update_audio(this);
        _Var6.super__Head_base<0UL,_MSX::MemorySlotHandler_*,_false>._M_head_impl =
             this_00[uVar12].handler._M_t.
             super___uniq_ptr_impl<MSX::MemorySlotHandler,_std::default_delete<MSX::MemorySlotHandler>_>
             ._M_t.
             super__Tuple_impl<0UL,_MSX::MemorySlotHandler_*,_std::default_delete<MSX::MemorySlotHandler>_>
             .super__Head_base<0UL,_MSX::MemorySlotHandler_*,_false>;
        IVar7 = this_00[uVar12].cycles_since_update.super_WrappedInt<HalfCycles>.length_;
        this_00[uVar12].cycles_since_update.super_WrappedInt<HalfCycles>.length_ = 0;
        (**(code **)(*(long *)_Var6.super__Head_base<0UL,_MSX::MemorySlotHandler_*,_false>.
                              _M_head_impl + 0x10))
                  (_Var6.super__Head_base<0UL,_MSX::MemorySlotHandler_*,_false>._M_head_impl,IVar7);
        _Var6.super__Head_base<0UL,_MSX::MemorySlotHandler_*,_false>._M_head_impl =
             this_00[uVar12].handler._M_t.
             super___uniq_ptr_impl<MSX::MemorySlotHandler,_std::default_delete<MSX::MemorySlotHandler>_>
             ._M_t.
             super__Tuple_impl<0UL,_MSX::MemorySlotHandler_*,_std::default_delete<MSX::MemorySlotHandler>_>
             .super__Head_base<0UL,_MSX::MemorySlotHandler_*,_false>;
        uVar2 = *cycle->value;
        uVar12 = (uint)(this->pc_address_ >> 0xd);
        puVar15 = this->read_pointers_[uVar12];
        puVar16 = PrimarySlot::read_pointer(&this_00->super_PrimarySlot,uVar12);
        (**(code **)(*(long *)_Var6.super__Head_base<0UL,_MSX::MemorySlotHandler_*,_false>.
                              _M_head_impl + 0x18))
                  (_Var6.super__Head_base<0UL,_MSX::MemorySlotHandler_*,_false>._M_head_impl,uVar11,
                   uVar2,puVar15 != puVar16);
      }
    }
    break;
  case Input:
    bVar10 = (byte)uVar11;
    uVar12 = bVar10 - 0x98;
    if (0x13 < uVar12) {
      if (bVar10 == 0xb5) break;
switchD_0030b83e_caseD_9c:
      *cycle->value = 0xff;
      break;
    }
    sVar17 = (long)&switchD_0030b83e::switchdataD_0046495c +
             (long)(int)(&switchD_0030b83e::switchdataD_0046495c)[uVar12];
    switch((uint)bVar10) {
    case 0x98:
    case 0x99:
      uVar22 = JustInTimeActor<TI::TMS::TMS9918<(TI::TMS::Personality)0>,_HalfCycles,_1,_1>::
               operator->((JustInTimeActor<TI::TMS::TMS9918<(TI::TMS::Personality)0>,_HalfCycles,_1,_1>
                           *)&new_speed);
      sVar14 = TI::TMS::TMS9918<(TI::TMS::Personality)0>::read
                         (local_50._M_head_impl,(uint)uVar11,
                          uVar22._M_t.
                          super___uniq_ptr_impl<TI::TMS::TMS9918<(TI::TMS::Personality)0>,_JustInTimeActor<TI::TMS::TMS9918<(TI::TMS::Personality)0>,_HalfCycles,_1,_1>::SequencePointAwareDeleter>
                          ._M_t.
                          super__Tuple_impl<0UL,_TI::TMS::TMS9918<(TI::TMS::Personality)0>_*,_JustInTimeActor<TI::TMS::TMS9918<(TI::TMS::Personality)0>,_HalfCycles,_1,_1>::SequencePointAwareDeleter>
                          .super__Head_base<0UL,_TI::TMS::TMS9918<(TI::TMS::Personality)0>_*,_false>
                          ._M_head_impl,sVar17);
      *cycle->value = (uint8_t)sVar14;
      std::
      unique_ptr<TI::TMS::TMS9918<(TI::TMS::Personality)0>,_JustInTimeActor<TI::TMS::TMS9918<(TI::TMS::Personality)0>,_HalfCycles,_1,_1>::SequencePointAwareDeleter>
      ::~unique_ptr((unique_ptr<TI::TMS::TMS9918<(TI::TMS::Personality)0>,_JustInTimeActor<TI::TMS::TMS9918<(TI::TMS::Personality)0>,_HalfCycles,_1,_1>::SequencePointAwareDeleter>
                     *)&new_speed);
      JustInTimeActor<TI::TMS::TMS9918<(TI::TMS::Personality)0>,_HalfCycles,_1,_1>::operator->
                ((JustInTimeActor<TI::TMS::TMS9918<(TI::TMS::Personality)0>,_HalfCycles,_1,_1> *)
                 &new_speed);
      bVar9 = TI::TMS::TMS9918<(TI::TMS::Personality)0>::get_interrupt_line(local_50._M_head_impl);
LAB_0030bc26:
      CPU::Z80::ProcessorBase::set_interrupt_line
                (&(this->z80_).super_ProcessorBase,bVar9,(HalfCycles)0x0);
      std::
      unique_ptr<TI::TMS::TMS9918<(TI::TMS::Personality)0>,_JustInTimeActor<TI::TMS::TMS9918<(TI::TMS::Personality)0>,_HalfCycles,_1,_1>::SequencePointAwareDeleter>
      ::~unique_ptr((unique_ptr<TI::TMS::TMS9918<(TI::TMS::Personality)0>,_JustInTimeActor<TI::TMS::TMS9918<(TI::TMS::Personality)0>,_HalfCycles,_1,_1>::SequencePointAwareDeleter>
                     *)&new_speed);
    case 0x9a:
    case 0x9b:
      goto switchD_0030b7cc_caseD_9a;
    default:
      goto switchD_0030b83e_caseD_9c;
    case 0xa2:
      update_audio(this);
      bVar10 = GI::AY38910::Utility::read<GI::AY38910::AY38910<false>>(&(this->speaker_).ay);
      break;
    case 0xa8:
    case 0xa9:
    case 0xaa:
    case 0xab:
      sVar14 = Intel::i8255::
               i8255<MSX::ConcreteMachine<(Analyser::Static::MSX::Target::Model)0,_true>::i8255PortHandler>
               ::read(&this->i8255_,(uint)uVar11,(void *)(ulong)bVar10,sVar17);
      bVar10 = (byte)sVar14;
    }
    goto LAB_0030baab;
  case Output:
    uVar20 = uVar11 & 0xff;
    uVar12 = uVar11 & 0xff;
    __fd = (uint)uVar11;
    if (uVar12 - 0x98 < 0x1e) {
      sVar17 = (long)&switchD_0030b7cc::switchdataD_004648e4 +
               (long)(int)(&switchD_0030b7cc::switchdataD_004648e4)[uVar12 - 0x98];
      switch(uVar12) {
      case 0x98:
      case 0x99:
        JustInTimeActor<TI::TMS::TMS9918<(TI::TMS::Personality)0>,_HalfCycles,_1,_1>::operator->
                  ((JustInTimeActor<TI::TMS::TMS9918<(TI::TMS::Personality)0>,_HalfCycles,_1,_1> *)
                   &new_speed);
        TI::TMS::TMS9918<(TI::TMS::Personality)0>::write
                  (local_50._M_head_impl,__fd,(void *)(ulong)*cycle->value,sVar17);
        std::
        unique_ptr<TI::TMS::TMS9918<(TI::TMS::Personality)0>,_JustInTimeActor<TI::TMS::TMS9918<(TI::TMS::Personality)0>,_HalfCycles,_1,_1>::SequencePointAwareDeleter>
        ::~unique_ptr((unique_ptr<TI::TMS::TMS9918<(TI::TMS::Personality)0>,_JustInTimeActor<TI::TMS::TMS9918<(TI::TMS::Personality)0>,_HalfCycles,_1,_1>::SequencePointAwareDeleter>
                       *)&new_speed);
        JustInTimeActor<TI::TMS::TMS9918<(TI::TMS::Personality)0>,_HalfCycles,_1,_1>::operator->
                  ((JustInTimeActor<TI::TMS::TMS9918<(TI::TMS::Personality)0>,_HalfCycles,_1,_1> *)
                   &new_speed);
        bVar9 = TI::TMS::TMS9918<(TI::TMS::Personality)0>::get_interrupt_line(local_50._M_head_impl)
        ;
        goto LAB_0030bc26;
      case 0x9a:
      case 0x9b:
      case 0xb4:
      case 0xb5:
        break;
      default:
        goto switchD_0030b7cc_caseD_9c;
      case 0xa0:
      case 0xa1:
        update_audio(this);
        GI::AY38910::Utility::write<GI::AY38910::AY38910<false>>
                  (&(this->speaker_).ay,uVar20 == 0xa1,*cycle->value);
        break;
      case 0xa8:
      case 0xa9:
      case 0xaa:
      case 0xab:
        Intel::i8255::
        i8255<MSX::ConcreteMachine<(Analyser::Static::MSX::Target::Model)0,_true>::i8255PortHandler>
        ::write(&this->i8255_,__fd,(void *)(ulong)*cycle->value,sVar17);
      }
    }
    else {
      if (uVar12 - 0xfc < 4) break;
      if (uVar12 - 0x7c < 2) {
        Yamaha::OPL::OPLBase<Yamaha::OPL::OPLL,_false>::write
                  (&(this->speaker_).opll.super_OPLBase<Yamaha::OPL::OPLL,_false>,__fd,
                   (void *)(ulong)*cycle->value,(ulong)(uVar12 - 0xfc));
        break;
      }
switchD_0030b7cc_caseD_9c:
      printf("Unhandled write %02x of %02x\n",(ulong)uVar20,(ulong)*cycle->value);
    }
    break;
  case Interrupt:
    *cycle->value = 0xff;
    if ((this->input_text_)._M_string_length != 0) {
      puVar15 = ram(this);
      uVar2 = puVar15[0xf3fa];
      puVar15 = ram(this);
      uVar3 = puVar15[0xf3fb];
      puVar15 = ram(this);
      uVar4 = puVar15[0xf3f8];
      puVar15 = ram(this);
      uVar21 = 0;
      iVar13 = CONCAT11(puVar15[0xf3f9],uVar4) - 0xfbf0;
      while ((uVar21 < (this->input_text_)._M_string_length &&
             (iVar18 = (iVar13 + 1) % 0x28, iVar18 != CONCAT11(uVar3,uVar2) - 0xfbf0))) {
        uVar4 = (this->input_text_)._M_dataplus._M_p[uVar21];
        puVar15 = ram(this);
        puVar15[(long)iVar13 + 0xfbf0] = uVar4;
        uVar21 = uVar21 + 1;
        iVar13 = iVar18;
      }
      pcVar8 = (this->input_text_)._M_dataplus._M_p;
      std::__cxx11::string::erase(&this->input_text_,pcVar8,pcVar8 + uVar21);
      puVar15 = ram(this);
      puVar15[0xf3f8] = (uint8_t)(iVar13 + 0xfbf0);
      puVar15 = ram(this);
      puVar15[0xf3f9] = (uint8_t)((uint)(iVar13 + 0xfbf0) >> 8);
    }
  }
switchD_0030b7cc_caseD_9a:
  if (this->tape_player_is_sleeping_ == false) {
    Storage::Tape::BinaryTapePlayer::run_for
              (&this->tape_player_,
               (Cycles)(long)(int)(cycle->length).super_WrappedInt<HalfCycles>.length_);
  }
  return (HalfCycles)(WrappedInt<HalfCycles>)WVar19.length_;
}

Assistant:

forceinline HalfCycles perform_machine_cycle(const CPU::Z80::PartialMachineCycle &cycle) {
			// Per the best information I currently have, the MSX inserts an extra cycle into each opcode read,
			// but otherwise runs without pause.
			const HalfCycles addition((cycle.operation == CPU::Z80::PartialMachineCycle::ReadOpcode) ? 2 : 0);
			const HalfCycles total_length = addition + cycle.length;
			if(vdp_ += total_length) {
				z80_.set_interrupt_line(vdp_->get_interrupt_line(), vdp_.last_sequence_point_overrun());
			}
			time_since_ay_update_ += total_length;
			memory_slots_[0].cycles_since_update += total_length;
			memory_slots_[1].cycles_since_update += total_length;
			memory_slots_[2].cycles_since_update += total_length;
			memory_slots_[3].cycles_since_update += total_length;

			if constexpr (model >= Target::Model::MSX2) {
				clock_.run_for(total_length);
			}

			if(cycle.is_terminal()) {
				uint16_t address = cycle.address ? *cycle.address : 0x0000;
				switch(cycle.operation) {
					case CPU::Z80::PartialMachineCycle::ReadOpcode:
						if(use_fast_tape_) {
							if(address == 0x1a63) {
								// TAPION

								// Enable the tape motor.
								i8255_.write(0xab, 0x8);

								// Disable interrupts.
								z80_.set_value_of(CPU::Z80::Register::IFF1, 0);
								z80_.set_value_of(CPU::Z80::Register::IFF2, 0);

								// Use the parser to find a header, and if one is found then populate
								// LOWLIM and WINWID, and reset carry. Otherwise set carry.
								using Parser = Storage::Tape::MSX::Parser;
								std::unique_ptr<Parser::FileSpeed> new_speed = Parser::find_header(tape_player_);
								if(new_speed) {
									ram()[0xfca4] = new_speed->minimum_start_bit_duration;
									ram()[0xfca5] = new_speed->low_high_disrimination_duration;
									z80_.set_value_of(CPU::Z80::Register::Flags, 0);
								} else {
									z80_.set_value_of(CPU::Z80::Register::Flags, 1);
								}

								// RET.
								*cycle.value = 0xc9;
								break;
							}

							if(address == 0x1abc) {
								// TAPIN

								// Grab the current values of LOWLIM and WINWID.
								using Parser = Storage::Tape::MSX::Parser;
								Parser::FileSpeed tape_speed;
								tape_speed.minimum_start_bit_duration = ram()[0xfca4];
								tape_speed.low_high_disrimination_duration = ram()[0xfca5];

								// Ask the tape parser to grab a byte.
								int next_byte = Parser::get_byte(tape_speed, tape_player_);

								// If a byte was found, return it with carry unset. Otherwise set carry to
								// indicate error.
								if(next_byte >= 0) {
									z80_.set_value_of(CPU::Z80::Register::A, uint16_t(next_byte));
									z80_.set_value_of(CPU::Z80::Register::Flags, 0);
								} else {
									z80_.set_value_of(CPU::Z80::Register::Flags, 1);
								}

								// RET.
								*cycle.value = 0xc9;
								break;
							}
						}

						if(!address) {
							pc_zero_accesses_++;
						}

						// TODO: below relates to confidence measurements. Reinstate, somehow.
//						if(is_unpopulated_[address >> 13] == unpopulated_) {
//							performed_unmapped_access_ = true;
//						}

						pc_address_ = address;	// This is retained so as to be able to name the source of an access to cartridge handlers.
						[[fallthrough]];

					case CPU::Z80::PartialMachineCycle::Read:
						if(address == 0xffff && final_slot_->supports_secondary_paging) {
							*cycle.value = final_slot_->secondary_paging() ^ 0xff;
							break;
						}

						if(read_pointers_[address >> 13]) {
							*cycle.value = read_pointers_[address >> 13][address & 8191];
						} else {
							const int slot_hit = (primary_slots_ >> ((address >> 14) * 2)) & 3;
							memory_slots_[slot_hit].handler->run_for(memory_slots_[slot_hit].cycles_since_update.template flush<HalfCycles>());
							*cycle.value = memory_slots_[slot_hit].handler->read(address);
						}
					break;

					case CPU::Z80::PartialMachineCycle::Write: {
						if(address == 0xffff && final_slot_->supports_secondary_paging) {
							final_slot_->set_secondary_paging(*cycle.value);
							update_paging();
							break;
						}

						const int slot_hit = (primary_slots_ >> ((address >> 14) * 2)) & 3;
						if(memory_slots_[slot_hit].handler) {
							update_audio();
							memory_slots_[slot_hit].handler->run_for(memory_slots_[slot_hit].cycles_since_update.template flush<HalfCycles>());
							memory_slots_[slot_hit].handler->write(
								address,
								*cycle.value,
								read_pointers_[pc_address_ >> 13] != memory_slots_[0].read_pointer(pc_address_ >> 13));
						} else {
							write_pointers_[address >> 13][address & 8191] = *cycle.value;
						}
					} break;

					case CPU::Z80::PartialMachineCycle::Input:
						switch(address & 0xff) {
							case 0x9a:	case 0x9b:
								if constexpr (vdp_model() == TI::TMS::TMS9918A) {
									break;
								}
								[[fallthrough]];
							case 0x98:	case 0x99:
								*cycle.value = vdp_->read(address);
								z80_.set_interrupt_line(vdp_->get_interrupt_line());
							break;

							case 0xa2:
								update_audio();
								*cycle.value = GI::AY38910::Utility::read(speaker_.ay);
							break;

							case 0xa8:	case 0xa9:
							case 0xaa:	case 0xab:
								*cycle.value = i8255_.read(address);
							break;

							case 0xb5:
								if constexpr (model == Target::Model::MSX1) {
									break;
								}
								*cycle.value = clock_.read(next_clock_register_);
							break;

							case 0xfc: case 0xfd: case 0xfe: case 0xff:
								if constexpr (model != Target::Model::MSX1) {
									*cycle.value = ram_mapper_[(address & 0xff) - 0xfc];
									break;
								}
								[[fallthrough]];

							default:
//								printf("Unhandled read %02x\n", address & 0xff);
								*cycle.value = 0xff;
							break;
						}
					break;

					case CPU::Z80::PartialMachineCycle::Output: {
						const int port = address & 0xff;
						switch(port) {
							case 0x9a:	case 0x9b:
								if constexpr (vdp_model() == TI::TMS::TMS9918A) {
									break;
								}
								[[fallthrough]];
							case 0x98:	case 0x99:
								vdp_->write(address, *cycle.value);
								z80_.set_interrupt_line(vdp_->get_interrupt_line());
							break;

							case 0xa0:	case 0xa1:
								update_audio();
								GI::AY38910::Utility::write(speaker_.ay, port == 0xa1, *cycle.value);
							break;

							case 0xa8:	case 0xa9:
							case 0xaa:	case 0xab:
								i8255_.write(address, *cycle.value);
							break;

							case 0xb4:
								if constexpr (model == Target::Model::MSX1) {
									break;
								}
								next_clock_register_ = *cycle.value;
							break;
							case 0xb5:
								if constexpr (model == Target::Model::MSX1) {
									break;
								}
								clock_.write(next_clock_register_, *cycle.value);
							break;

							case 0xfc: case 0xfd: case 0xfe: case 0xff: {
								if constexpr (model == Target::Model::MSX1) {
									break;
								}

								ram_mapper_[port - 0xfc] = *cycle.value;

								// Apply to RAM.
								//
								// On a real MSX this may also affect other slots.
								// I've not yet needed it to propagate further, so
								// have not implemented any onward route.
								const uint16_t region = uint16_t((port - 0xfc) << 14);
								const size_t base = size_t(*cycle.value) << 14;
								if(base < RAMSize) {
									ram_slot().template map<MemorySlot::AccessType::ReadWrite>(base, region, 0x4000);
								} else {
									ram_slot().unmap(region, 0x4000);
								}

								update_paging();
							} break;

							case 0x7c:	case 0x7d:
								if constexpr (has_opll) {
									speaker_.opll.write(address, *cycle.value);
									break;
								}
								[[fallthrough]];

							default:
								printf("Unhandled write %02x of %02x\n", address & 0xff, *cycle.value);
							break;
						}
					} break;

					case CPU::Z80::PartialMachineCycle::Interrupt:
						*cycle.value = 0xff;

						// Take this as a convenient moment to jump into the keyboard buffer, if desired.
						if(!input_text_.empty()) {
							// The following are KEYBUF per the Red Book; its address and its definition as DEFS 40.
							const int buffer_start = 0xfbf0;
							const int buffer_size = 40;

							// Also from the Red Book: GETPNT is at F3FAH and PUTPNT is at F3F8H.
							int read_address = ram()[0xf3fa] | (ram()[0xf3fb] << 8);
							int write_address = ram()[0xf3f8] | (ram()[0xf3f9] << 8);

							// Write until either the string is exhausted or the write_pointer is immediately
							// behind the read pointer; temporarily map write_address and read_address into
							// buffer-relative values.
							std::size_t characters_written = 0;
							write_address -= buffer_start;
							read_address -= buffer_start;
							while(characters_written < input_text_.size()) {
								const int next_write_address = (write_address + 1) % buffer_size;
								if(next_write_address == read_address) break;
								ram()[write_address + buffer_start] = uint8_t(input_text_[characters_written]);
								++characters_written;
								write_address = next_write_address;
							}
							input_text_.erase(input_text_.begin(), input_text_.begin() + std::string::difference_type(characters_written));

							// Map the write address back into absolute terms and write it out again as PUTPNT.
							write_address += buffer_start;
							ram()[0xf3f8] = uint8_t(write_address);
							ram()[0xf3f9] = uint8_t(write_address >> 8);
						}
					break;

					default: break;
				}
			}

			if(!tape_player_is_sleeping_)
				tape_player_.run_for(int(cycle.length.as_integral()));

			return addition;
		}